

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::AddSectionDictionary
          (TemplateDictionary *this,TemplateString section_name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *c;
  TemplateDictionary *pTVar1;
  TemplateId v;
  size_type sVar2;
  TemplateString local_80;
  TemplateDictionary *local_60;
  TemplateDictionary *retval;
  string newname;
  vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
  *local_18;
  DictVector *dicts;
  TemplateDictionary *this_local;
  
  LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&this->section_dict_);
  c = this->section_dict_;
  v = TemplateString::GetGlobalId(&section_name);
  local_18 = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                       (c,v);
  if (local_18 == (second_type)0x0) {
    local_18 = CreateDictVector(this);
    std::
    vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
    ::reserve(local_18,8);
    HashInsert<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>
              (this->section_dict_,section_name,local_18);
  }
  if (local_18 !=
      (vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
       *)0x0) {
    sVar2 = std::
            vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
            ::size(local_18);
    CreateSubdictName_abi_cxx11_
              ((TemplateString *)&retval,&this->name_,(size_t)&section_name,(char *)(sVar2 + 1));
    TemplateString::TemplateString(&local_80,(string *)&retval);
    local_60 = CreateTemplateSubdict
                         (this,&local_80,this->arena_,this,this->template_global_dict_owner_);
    std::
    vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
    ::push_back(local_18,&local_60);
    pTVar1 = local_60;
    std::__cxx11::string::~string((string *)&retval);
    return pTVar1;
  }
  __assert_fail("dicts != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x23d,
                "TemplateDictionary *ctemplate::TemplateDictionary::AddSectionDictionary(const TemplateString)"
               );
}

Assistant:

TemplateDictionary* TemplateDictionary::AddSectionDictionary(
    const TemplateString section_name) {
  LazilyCreateDict(&section_dict_);
  DictVector* dicts = find_ptr2(*section_dict_, section_name.GetGlobalId());
  if (!dicts) {
    dicts = CreateDictVector();
    // Since most lists will remain under 8 or 16 entries but will frequently
    // be more than four, this prevents copying from 1->2->4->8.
    dicts->reserve(8);
    HashInsert(section_dict_, section_name, dicts);
  }
  assert(dicts != NULL);
  const string newname(CreateSubdictName(name_, section_name,
                                         dicts->size() + 1, ""));
  TemplateDictionary* retval = CreateTemplateSubdict(
      newname, arena_, this, template_global_dict_owner_);
  dicts->push_back(retval);
  return retval;
}